

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin>::Exec
          (SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin> *this,
          Matcher *matcher,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *inputOffset,CharCount *nextSyncInputOffset,uint8 **instPointer,
          ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  uint uVar1;
  CharCount CVar2;
  bool bVar3;
  uint uVar4;
  
  uVar1 = (this->super_BackupMixin).backup.lower;
  CVar2 = *matchStart;
  if (inputLength - CVar2 < uVar1) {
LAB_00f048dc:
    *matchStart = inputLength;
    bVar3 = true;
  }
  else {
    if (*inputOffset < *nextSyncInputOffset) {
      *instPointer = *instPointer + 0xd;
    }
    else {
      if (*inputOffset - CVar2 < uVar1) {
        *inputOffset = CVar2 + uVar1;
      }
      bVar3 = Char2LiteralScannerMixin::Match
                        (&this->super_Char2LiteralScannerMixin,matcher,input,inputLength,inputOffset
                        );
      if (!bVar3) goto LAB_00f048dc;
      *nextSyncInputOffset = *inputOffset + 1;
      uVar1 = (this->super_BackupMixin).backup.upper;
      if (uVar1 != 0xffffffff) {
        uVar4 = *inputOffset - *matchStart;
        if (uVar1 <= uVar4) {
          uVar4 = uVar1;
        }
        *matchStart = *inputOffset - uVar4;
      }
      *inputOffset = *matchStart;
      *instPointer = *instPointer + 0xd;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool SyncToLiteralAndBackupInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if(inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Set new start at most backup.upper from start of literal
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;

        instPointer += sizeof(*this);
        return false;
    }